

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlReportText.cpp
# Opt level: O2

string * __thiscall
oout::XmlReportText::asString_abi_cxx11_(string *__return_storage_ptr__,XmlReportText *this)

{
  ostream *poVar1;
  FmtJunitXml format;
  ostringstream out;
  string local_1c0 [32];
  undefined **local_1a0;
  CountFailure local_198 [23];
  
  CountFailure::CountFailure(local_198,&this->result);
  CountFailure::count(local_198);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_198[0].result.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  poVar1 = std::operator<<((ostream *)local_198,"<?xml version=\'1.0\' encoding=\'UTF-8\'?>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)local_198,"<testsuites ");
  poVar1 = std::operator<<(poVar1,"errors=\'");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\' ");
  poVar1 = std::operator<<(poVar1,"failures=\'");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\'>");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_1a0 = &PTR__Format_001cdc00;
  (*((this->result).super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_Result[2])(local_1c0);
  std::operator<<((ostream *)local_198,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  poVar1 = std::operator<<((ostream *)local_198,"</testsuites>");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

string XmlReportText::asString() const
{
	const auto failure_count = CountFailure(result).count();

	ostringstream out;
	out << "<?xml version='1.0' encoding='UTF-8'?>" << endl;
	out << "<testsuites "
	    << "errors='" << failure_count << "' "
	    << "failures='" << failure_count << "'>"
	    << endl;

	FmtJunitXml format;
	out << result->print(format);

	out << "</testsuites>" << endl;
	return out.str();
}